

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::validate_multilayer_metadata(MultilayerMetadata *multilayer)

{
  uint uVar1;
  FILE *__stream;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pLVar5;
  uint *in_RDI;
  LayerMetadata *layer_1;
  int i;
  LayerMetadata *layer;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_> *__range2;
  MultilayerViewType view_type;
  bool same_view_type;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
  *in_stack_ffffffffffffff90;
  uint local_3c;
  __normal_iterator<const_libaom_examples::LayerMetadata_*,_std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>_>
  local_28;
  uint *local_20;
  MultilayerViewType local_18;
  byte local_11;
  uint *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  bVar2 = std::
          vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
          empty(in_stack_ffffffffffffff90);
  if (bVar2) {
    fprintf(_stderr,"Error: No layers found, there must be at least one\n");
    local_1 = false;
  }
  else {
    sVar3 = std::
            vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
            ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                    *)(local_10 + 2));
    __stream = _stderr;
    if (sVar3 < 5) {
      local_11 = 1;
      pvVar4 = std::
               vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ::operator[]((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                             *)(local_10 + 2),0);
      local_18 = pvVar4->layer_view_type;
      local_20 = local_10 + 2;
      local_28._M_current =
           (LayerMetadata *)
           std::
           vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
           begin((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
      end((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_> *
          )CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_libaom_examples::LayerMetadata_*,_std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (__normal_iterator<const_libaom_examples::LayerMetadata_*,_std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
            bVar2) {
        pLVar5 = __gnu_cxx::
                 __normal_iterator<const_libaom_examples::LayerMetadata_*,_std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>_>
                 ::operator*(&local_28);
        if (pLVar5->layer_view_type != local_18) {
          local_11 = 0;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_libaom_examples::LayerMetadata_*,_std::vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>_>
        ::operator++(&local_28);
      }
      for (local_3c = 0;
          sVar3 = std::
                  vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                  ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                          *)(local_10 + 2)), (int)local_3c < (int)sVar3; local_3c = local_3c + 1) {
        pvVar4 = std::
                 vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                 ::operator[]((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                               *)(local_10 + 2),(long)(int)local_3c);
        uVar1 = *local_10;
        if ((((uVar1 - 1 < 2) || (uVar1 - 5 < 3)) || (uVar1 == 10 || uVar1 == 0xb)) &&
           (pvVar4->layer_metadata_scope != SCOPE_GLOBAL)) {
          fprintf(_stderr,
                  "Error: for use_case %d, all layers must have scope %d, found %d instead for layer %d (zero-based index)\n"
                  ,(ulong)*local_10,2,(ulong)pvVar4->layer_metadata_scope,(ulong)local_3c);
          return false;
        }
        if (((*local_10 - 1 < 4) || (*local_10 - 10 < 4)) && ((local_11 & 1) == 0)) {
          fprintf(_stderr,
                  "Error: for use_case %d, all layers must have the same view type, found different view_type for layer %d (zero-based index)\n"
                  ,(ulong)*local_10,(ulong)local_3c);
          return false;
        }
        if (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_UNSPECIFIED) {
          switch(*local_10) {
          case 1:
          case 3:
          case 6:
          case 8:
            if ((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE) &&
               (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_ALPHA)) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,1,5,(ulong)pvVar4->layer_type,local_3c);
              return false;
            }
            break;
          case 2:
          case 4:
          case 7:
          case 9:
            if ((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE) &&
               (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_DEPTH)) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,1,6,(ulong)pvVar4->layer_type,local_3c);
              return false;
            }
            break;
          case 5:
            if (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,1,(ulong)pvVar4->layer_type,(ulong)local_3c);
              return false;
            }
            break;
          case 10:
            if (((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1) &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2)) &&
               ((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3 &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_ALPHA)))) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,2,3,4,5,pvVar4->layer_type,local_3c);
              return false;
            }
            break;
          case 0xb:
            if (((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1) &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2)) &&
               ((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3 &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_DEPTH)))) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,2,3,4,6,pvVar4->layer_type,local_3c);
              return false;
            }
            break;
          case 0xc:
            if (((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1) &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2)) &&
               (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3)) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,2,3,4,pvVar4->layer_type,local_3c);
              return false;
            }
            break;
          case 0xd:
            if (((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE) &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1)) &&
               ((pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2 &&
                (pvVar4->layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3)))) {
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                      ,(ulong)*local_10,1,2,3,4,pvVar4->layer_type,local_3c);
              return false;
            }
          }
        }
        if (1 << ((byte)local_3c & 0x1f) <= (int)(uint)pvVar4->layer_dependency_idc) {
          fprintf(_stderr,
                  "Error: layer_dependency_idc of layer %d (zero-based index) must be in [0, %d], found %d for layer %d (zero-based index)\n"
                  ,(ulong)local_3c,(ulong)((1 << ((byte)local_3c & 0x1f)) - 1),
                  (ulong)pvVar4->layer_dependency_idc,(ulong)local_3c);
          return false;
        }
        if (((pvVar4->layer_type == MULTILAYER_LAYER_TYPE_ALPHA) ||
            (pvVar4->layer_type == MULTILAYER_LAYER_TYPE_DEPTH)) &&
           (((pvVar4->layer_color_description).second & 1U) != 0)) {
          fprintf(_stderr,
                  "Error: alpha or depth layers cannot have layer_color_description for layer %d (zero-based index)\n"
                  ,(ulong)local_3c);
          return false;
        }
      }
      local_1 = true;
    }
    else {
      sVar3 = std::
              vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                      *)(local_10 + 2));
      fprintf(__stream,"Error: Too many layers, found %d, max 4\n",sVar3 & 0xffffffff);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool validate_multilayer_metadata(const MultilayerMetadata &multilayer) {
  if (multilayer.layers.empty()) {
    fprintf(stderr, "Error: No layers found, there must be at least one\n");
    return false;
  }
  if (multilayer.layers.size() > 4) {
    fprintf(stderr, "Error: Too many layers, found %d, max 4\n",
            static_cast<int>(multilayer.layers.size()));
    return false;
  }

  bool same_view_type = true;
  MultilayerViewType view_type = multilayer.layers[0].layer_view_type;
  for (const LayerMetadata &layer : multilayer.layers) {
    if (layer.layer_view_type != view_type) {
      same_view_type = false;
      break;
    }
  }

  for (int i = 0; i < static_cast<int>(multilayer.layers.size()); ++i) {
    const LayerMetadata &layer = multilayer.layers[i];
    switch (multilayer.use_case) {
      case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
      case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
      case MULTILAYER_USE_CASE_STEREO:
      case MULTILAYER_USE_CASE_STEREO_GLOBAL_ALPHA:
      case MULTILAYER_USE_CASE_STEREO_GLOBAL_DEPTH:
      case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
      case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
        if (layer.layer_metadata_scope != SCOPE_GLOBAL) {
          fprintf(
              stderr,
              "Error: for use_case %d, all layers must have scope %d, found %d "
              "instead for layer %d (zero-based index)\n",
              multilayer.use_case, SCOPE_GLOBAL, layer.layer_metadata_scope, i);
          return false;
        }
        break;
      default: break;
    }
    switch (multilayer.use_case) {
      case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
      case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
      case MULTILAYER_USE_CASE_ALPHA:
      case MULTILAYER_USE_CASE_DEPTH:
      case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
      case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
      case MULTILAYER_USE_CASE_444:
      case MULTILAYER_USE_CASE_420_444:
        if (!same_view_type) {
          fprintf(stderr,
                  "Error: for use_case %d, all layers must have the same view "
                  "type, found different view_type for layer %d (zero-based "
                  "index)\n",
                  multilayer.use_case, i);
          return false;
        }
      default: break;
    }
    if (layer.layer_type != MULTILAYER_LAYER_TYPE_UNSPECIFIED)
      switch (multilayer.use_case) {
        case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
        case MULTILAYER_USE_CASE_ALPHA:
        case MULTILAYER_USE_CASE_STEREO_GLOBAL_ALPHA:
        case MULTILAYER_USE_CASE_STEREO_ALPHA:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_ALPHA) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d or "
                    "%d, found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE,
                    MULTILAYER_LAYER_TYPE_ALPHA, layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
        case MULTILAYER_USE_CASE_DEPTH:
        case MULTILAYER_USE_CASE_STEREO_GLOBAL_DEPTH:
        case MULTILAYER_USE_CASE_STEREO_DEPTH:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_DEPTH) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d or "
                    "%d, found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE,
                    MULTILAYER_LAYER_TYPE_DEPTH, layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_STEREO:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d, "
                    "found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE,
                    layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_ALPHA) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d, "
                    "%d, %d, or %d, found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE_1,
                    MULTILAYER_LAYER_TYPE_TEXTURE_2,
                    MULTILAYER_LAYER_TYPE_TEXTURE_3,
                    MULTILAYER_LAYER_TYPE_ALPHA, layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_DEPTH) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d, "
                    "%d, %d, or %d, found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE_1,
                    MULTILAYER_LAYER_TYPE_TEXTURE_2,
                    MULTILAYER_LAYER_TYPE_TEXTURE_3,
                    MULTILAYER_LAYER_TYPE_DEPTH, layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_444:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3) {
            fprintf(
                stderr,
                "Error: for use_case %d, all layers must be of type %d, %d, or "
                "%d, found %d for layer %d (zero-based index)\n",
                multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE_1,
                MULTILAYER_LAYER_TYPE_TEXTURE_2,
                MULTILAYER_LAYER_TYPE_TEXTURE_3, layer.layer_type, i);
            return false;
          }
          break;
        case MULTILAYER_USE_CASE_420_444:
          if (layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_1 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_2 &&
              layer.layer_type != MULTILAYER_LAYER_TYPE_TEXTURE_3) {
            fprintf(stderr,
                    "Error: for use_case %d, all layers must be of type %d, "
                    "%d, %d, or %d, found %d for layer %d (zero-based index)\n",
                    multilayer.use_case, MULTILAYER_LAYER_TYPE_TEXTURE,
                    MULTILAYER_LAYER_TYPE_TEXTURE_1,
                    MULTILAYER_LAYER_TYPE_TEXTURE_2,
                    MULTILAYER_LAYER_TYPE_TEXTURE_3, layer.layer_type, i);
            return false;
          }
          break;
        default: break;
      }
    if (layer.layer_dependency_idc >= (1 << i)) {
      fprintf(stderr,
              "Error: layer_dependency_idc of layer %d (zero-based index) must "
              "be in [0, %d], found %d for layer %d (zero-based index)\n",
              i, (1 << i) - 1, layer.layer_dependency_idc, i);
      return false;
    }
    if ((layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA ||
         layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH) &&
        layer.layer_color_description.second) {
      fprintf(stderr,
              "Error: alpha or depth layers cannot have "
              "layer_color_description for layer %d (zero-based index)\n",
              i);
      return false;
    }
  }
  return true;
}